

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

void __thiscall
Rml::Context::GenerateMouseEventParameters(Context *this,Dictionary *parameters,int button_index)

{
  type pVVar1;
  
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::reserve(&parameters->m_container,3);
  pVVar1 = itlib::
           flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           ::operator[]<char_const(&)[8]>
                     ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                       *)parameters,(char (*) [8])"mouse_x");
  Variant::Clear(pVVar1);
  Variant::Set(pVVar1,(this->mouse_position).x);
  pVVar1 = itlib::
           flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           ::operator[]<char_const(&)[8]>
                     ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                       *)parameters,(char (*) [8])"mouse_y");
  Variant::Clear(pVVar1);
  Variant::Set(pVVar1,(this->mouse_position).y);
  if (-1 < button_index) {
    pVVar1 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[7]>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)parameters,(char (*) [7])"button");
    Variant::Clear(pVVar1);
    Variant::Set(pVVar1,button_index);
    return;
  }
  return;
}

Assistant:

void Context::GenerateMouseEventParameters(Dictionary& parameters, int button_index)
{
	parameters.reserve(3);
	parameters["mouse_x"] = mouse_position.x;
	parameters["mouse_y"] = mouse_position.y;
	if (button_index >= 0)
		parameters["button"] = button_index;
}